

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstruct<long_double>::ComputeWeightsLocal
          (TPZDohrSubstruct<long_double> *this,TPZFMatrix<long_double> *StiffnessDiagLocal)

{
  longdouble lVar1;
  longdouble lVar2;
  int iVar3;
  int *piVar4;
  ulong uVar5;
  longdouble *plVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  uVar10 = (this->fGlobalEqs).fNElements;
  uVar12 = 0;
  iVar9 = (int)uVar10;
  uVar5 = 0;
  if (0 < iVar9) {
    uVar5 = uVar10 & 0xffffffff;
  }
  for (; plVar6 = (this->fWeights).super_TPZVec<long_double>.fStore, uVar5 != uVar12;
      uVar12 = uVar12 + 1) {
    iVar3 = (this->fGlobalEqs).fStore[uVar12].first;
    lVar1 = plVar6[iVar3];
    plVar6 = TPZFMatrix<long_double>::operator()(StiffnessDiagLocal,uVar12,0);
    (this->fWeights).super_TPZVec<long_double>.fStore[iVar3] = lVar1 / *plVar6;
  }
  piVar4 = (this->fInternalEqs).fStore;
  lVar7 = (this->fInternalEqs).fNElements;
  lVar8 = 0;
  if (lVar7 < 1) {
    lVar7 = lVar8;
  }
  for (; lVar7 != lVar8; lVar8 = lVar8 + 1) {
    plVar6[piVar4[lVar8]] = (longdouble)1;
  }
  uVar10 = (this->fPhiC).super_TPZMatrix<long_double>.super_TPZBaseMatrix.fCol;
  TPZFMatrix<long_double>::Resize(&this->fPhiC_Weighted_Condensed,(long)iVar9,uVar10);
  uVar12 = 0;
  uVar11 = 0;
  if (0 < (int)uVar10) {
    uVar11 = uVar10 & 0xffffffff;
  }
  for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
    for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
      lVar7 = (long)(this->fGlobalEqs).fStore[uVar12].first;
      plVar6 = TPZFMatrix<long_double>::operator()(&this->fPhiC,lVar7,uVar10);
      lVar1 = *plVar6;
      lVar2 = (this->fWeights).super_TPZVec<long_double>.fStore[lVar7];
      plVar6 = TPZFMatrix<long_double>::operator()(&this->fPhiC_Weighted_Condensed,uVar12,uVar10);
      *plVar6 = lVar2 * lVar1;
    }
  }
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ComputeWeightsLocal(TPZFMatrix<TVar> &StiffnessDiagLocal) {
	int i;
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		fWeights[ind.first] = fWeights[ind.first] / StiffnessDiagLocal(i,0);
	}
	for(i=0; i<fInternalEqs.NElements(); i++)
	{
		fWeights[fInternalEqs[i]] = 1.;
	}
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Weights = " <<  fWeights;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	int c,nc = fPhiC.Cols();
#ifdef ZERO_INTERNAL_RESIDU
	// eliminate the values of v2 for internal equations
	int nint = fInternalEqs.NElements();
	for(i=0; i<nint; i++)
	{
		for(c=0; c<nc; c++)
		{
			fPhiC(fInternalEqs[i],c) = 0.;
		}
	}
#endif
	fPhiC_Weighted_Condensed.Resize(neqs,fPhiC.Cols());
	for (i=0;i<neqs;i++) 
	{
		for(c=0; c<nc; c++)
		{
			std::pair<int,int> ind = fGlobalEqs[i];
			fPhiC_Weighted_Condensed(i,c) = fPhiC(ind.first,c)*fWeights[ind.first];
		}
	}
}